

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

void __thiscall
indigox::utils::
Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>::RemoveVertex
          (Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>
           *this,VertType v)

{
  size_t *psVar1;
  void *pvVar2;
  ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *this_00;
  iterator iVar3;
  stored_vertex_conflict *su;
  VertType local_20;
  
  boost::
  clear_vertex<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>
            (v,(bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>
                *)(this->graph_).
                  super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
  pvVar2 = *(void **)((long)v + 0xb0);
  psVar1 = (size_t *)
           ((long)&(((this->graph_).
                     super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super_type).m_vertices.
                   super__List_base<void_*,_std::allocator<void_*>_>._M_impl + 0x10);
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(pvVar2,0x18);
  if (v != (VertType)0x0) {
    std::
    _Rb_tree<std::pair<void_*,_void_*>,_std::pair<void_*,_void_*>,_std::_Identity<std::pair<void_*,_void_*>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<void_*,_void_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<void_*,_void_*>,_std::pair<void_*,_void_*>,_std::_Identity<std::pair<void_*,_void_*>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<void_*,_void_*>_>_>
                 *)((long)v + 0x68));
    std::
    _Rb_tree<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_std::_Identity<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::less<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::allocator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>_>
    ::~_Rb_tree((_Rb_tree<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_std::_Identity<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::less<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::allocator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>_>
                 *)((long)v + 0x30));
    std::
    _Rb_tree<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_std::_Identity<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::less<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::allocator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>_>
    ::~_Rb_tree((_Rb_tree<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>,_std::_Identity<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::less<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_std::allocator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>_>
                 *)v);
    operator_delete(v,0xb8);
  }
  local_20 = v;
  iVar3 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>,void*,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>::left>,std::less<void*>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<void*,unsigned_long,mpl_::na,mpl_::na,mpl_::na>::core_indices,std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<void*>((ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>,void*,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,true>::left>,std::less<void*>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<void*,unsigned_long,mpl_::na,mpl_::na,mpl_::na>::core_indices,std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void*const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<unsigned_long_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                         *)(this->vert_idxmap_).left.super_map_adaptor<_1e6ad140_>.
                           super_ordered_associative_container_adaptor<_140da2db_>.super_type.
                           super_type.dwfb.data,&local_20);
  this_00 = &((this->vert_idxmap_).left.super_map_adaptor<_1e6ad140_>.
              super_ordered_associative_container_adaptor<_140da2db_>.super_type.super_type.dwfb.
             data)->super_type;
  if (iVar3.node !=
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
        **)(this_00 + -4)) {
    boost::multi_index::detail::
    ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::erase(this_00,v);
  }
  return;
}

Assistant:

void RemoveVertex(VertType v)
      {
        boost::clear_vertex(v, *graph_);
        boost::remove_vertex(v, *graph_);
        if (vert_idxmap_.left.find(v) != vert_idxmap_.left.end()) {
          vert_idxmap_.left.erase(v);
        }
        
      }